

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O2

LY_ERR lys_compile_feature_iffeatures(lysp_module *pmod)

{
  lysp_feature ***ppplVar1;
  ly_ctx *ctx;
  lyd_node *plVar2;
  lyd_node *plVar3;
  LY_ERR LVar4;
  lysp_feature *last;
  long *plVar5;
  ulong uVar6;
  lysc_iffeature *plVar7;
  undefined8 *puVar8;
  lysp_feature **pplVar9;
  void *pvVar10;
  size_t __n;
  lysp_feature *plVar11;
  lysp_qname *plVar12;
  ulong uVar13;
  lysp_feature *plVar14;
  long lVar15;
  long lVar16;
  void *pvVar17;
  lysp_feature **pplVar18;
  lysp_feature **pplVar19;
  uint32_t idx;
  ly_set local_68;
  lysp_feature *local_50;
  lysp_module *local_48;
  lysp_feature **local_40;
  ly_ctx *local_38;
  
  idx = 0;
  last = (lysp_feature *)0x0;
  do {
    do {
      last = lysp_feature_next(last,pmod,&idx);
      if (last == (lysp_feature *)0x0) {
        return LY_SUCCESS;
      }
      plVar12 = last->iffeatures;
    } while (plVar12 == (lysp_qname *)0x0);
    plVar7 = last->iffeatures_c;
    if (plVar7 == (lysc_iffeature *)0x0) {
      plVar5 = (long *)calloc(1,*(long *)&plVar12[-1].flags << 4 | 8);
      if (plVar5 == (long *)0x0) goto LAB_001510c3;
    }
    else {
      plVar5 = (long *)realloc(&plVar7[-1].features,
                               (*(long *)&plVar12[-1].flags + (long)plVar7[-1].features) * 0x10 | 8)
      ;
      if (plVar5 == (long *)0x0) {
LAB_001510c3:
        ly_log(pmod->mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_feature_iffeatures");
        return LY_EMEM;
      }
      plVar12 = last->iffeatures;
    }
    last->iffeatures_c = (lysc_iffeature *)(plVar5 + 1);
    if (plVar12 == (lysp_qname *)0x0) {
      __n = 0;
    }
    else {
      __n = *(long *)&plVar12[-1].flags << 4;
    }
    memset(plVar5 + *plVar5 * 2 + 1,0,__n);
    uVar13 = 0xffffffffffffffff;
    lVar16 = 0;
    lVar15 = 0;
    while( true ) {
      plVar12 = last->iffeatures;
      if (plVar12 == (lysp_qname *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ulong *)&plVar12[-1].flags;
      }
      uVar13 = uVar13 + 1;
      if (uVar6 <= uVar13) break;
      plVar7 = last->iffeatures_c;
      ppplVar1 = &plVar7[-1].features;
      *ppplVar1 = (lysp_feature **)((long)*ppplVar1 + 1);
      plVar12 = (lysp_qname *)((long)&plVar12->str + lVar15);
      lVar15 = lVar15 + 0x18;
      plVar7 = (lysc_iffeature *)((long)&plVar7->expr + lVar16);
      lVar16 = lVar16 + 0x10;
      LVar4 = lys_compile_iffeature(pmod->mod->ctx,plVar12,plVar7);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
    }
    plVar7 = last->iffeatures_c;
    pplVar19 = (lysp_feature **)0x0;
    local_48 = pmod;
    while( true ) {
      if (plVar7 == (lysc_iffeature *)0x0) {
        pplVar9 = (lysp_feature **)0x0;
      }
      else {
        pplVar9 = plVar7[-1].features;
      }
      if (pplVar9 <= pplVar19) break;
      plVar14 = (lysp_feature *)0x0;
      local_40 = pplVar19;
LAB_00150edf:
      pplVar9 = plVar7[(long)pplVar19].features;
      if (pplVar9 == (lysp_feature **)0x0) {
        plVar11 = (lysp_feature *)0x0;
      }
      else {
        plVar11 = pplVar9[-1];
      }
      if (plVar14 < plVar11) {
        plVar11 = pplVar9[(long)plVar14];
        ctx = pmod->mod->ctx;
        local_50 = plVar14;
        if (last == plVar11) {
          ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Feature \"%s\" is referenced from itself.",
                  last->name);
          return LY_EVALID;
        }
        pplVar9 = last->depfeatures;
        local_68.size = 0;
        local_68.count = 0;
        local_68.field_2.dnodes = (lyd_node **)0x0;
        pplVar18 = pplVar19;
        if (pplVar9 != (lysp_feature **)0x0) {
          plVar14 = (lysp_feature *)0x0;
          local_38 = ctx;
LAB_00150f33:
          if (plVar14 < pplVar9[-1]) {
            if (pplVar9[(long)plVar14] != plVar11) goto code_r0x00150f42;
LAB_00150fb8:
            ly_vlog(local_38,(char *)0x0,LYVE_REFERENCE,
                    "Feature \"%s\" is indirectly referenced from itself.",plVar11->name);
            LVar4 = LY_EVALID;
          }
          else {
            for (uVar13 = 0; uVar13 < (ulong)local_68._0_8_ >> 0x20; uVar13 = uVar13 + 1) {
              plVar2 = local_68.field_2.dnodes[uVar13];
              pvVar17 = (void *)0x0;
              while( true ) {
                plVar3 = plVar2->next;
                if (plVar3 == (lyd_node *)0x0) {
                  pvVar10 = (void *)0x0;
                }
                else {
                  pvVar10 = plVar3[-1].priv;
                }
                if (pvVar10 <= pvVar17) break;
                if (*(lysp_feature **)(&plVar3->hash + (long)pvVar17 * 2) == plVar11)
                goto LAB_00150fb8;
                ly_set_add(&local_68,*(lysp_feature **)(&plVar3->hash + (long)pvVar17 * 2),'\0',
                           (uint32_t *)0x0);
                pvVar17 = (void *)((long)pvVar17 + 1);
              }
            }
            LVar4 = LY_SUCCESS;
          }
          goto LAB_00150fd8;
        }
        goto LAB_00151001;
      }
      pplVar19 = (lysp_feature **)((long)pplVar19 + 1);
    }
  } while( true );
code_r0x00150f42:
  LVar4 = ly_set_add(&local_68,pplVar9[(long)plVar14],'\0',(uint32_t *)0x0);
  plVar14 = (lysp_feature *)((long)&plVar14->name + 1);
  if (LVar4 != LY_SUCCESS) goto LAB_00150fd8;
  goto LAB_00150f33;
LAB_00150fd8:
  ly_set_erase(&local_68,(_func_void_void_ptr *)0x0);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  plVar7 = last->iffeatures_c;
  pmod = local_48;
  pplVar18 = local_40;
LAB_00151001:
  plVar11 = local_50;
  plVar14 = plVar7[(long)pplVar19].features[(long)local_50];
  pplVar9 = plVar14->depfeatures;
  if (pplVar9 == (lysp_feature **)0x0) {
    puVar8 = (undefined8 *)malloc(0x10);
    if (puVar8 == (undefined8 *)0x0) goto LAB_001510c3;
    *puVar8 = 1;
  }
  else {
    plVar14 = pplVar9[-1];
    pplVar9[-1] = (lysp_feature *)((long)&plVar14->name + 1);
    puVar8 = (undefined8 *)realloc(pplVar9 + -1,(long)plVar14 * 8 + 0x10);
    plVar14 = last->iffeatures_c[(long)pplVar19].features[(long)plVar11];
    if (puVar8 == (undefined8 *)0x0) {
      plVar14->depfeatures[-1] = (lysp_feature *)&plVar14->depfeatures[-1][-1].field_0x3f;
      goto LAB_001510c3;
    }
  }
  plVar14->depfeatures = (lysp_feature **)(puVar8 + 1);
  pplVar19 = last->iffeatures_c[(long)pplVar19].features[(long)plVar11]->depfeatures;
  pplVar19[(long)&pplVar19[-1][-1].field_0x3f] = last;
  plVar14 = (lysp_feature *)((long)&plVar11->name + 1);
  plVar7 = last->iffeatures_c;
  pplVar19 = pplVar18;
  goto LAB_00150edf;
}

Assistant:

LY_ERR
lys_compile_feature_iffeatures(struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysp_feature *f = NULL, **df;
    uint32_t idx = 0;

    while ((f = lysp_feature_next(f, pmod, &idx))) {
        if (!f->iffeatures) {
            continue;
        }

        /* compile if-features */
        LY_ARRAY_CREATE_RET(pmod->mod->ctx, f->iffeatures_c, LY_ARRAY_COUNT(f->iffeatures), LY_EMEM);
        LY_ARRAY_FOR(f->iffeatures, u) {
            LY_ARRAY_INCREMENT(f->iffeatures_c);
            LY_CHECK_RET(lys_compile_iffeature(pmod->mod->ctx, &(f->iffeatures)[u], &(f->iffeatures_c)[u]));
        }
        LY_ARRAY_FOR(f->iffeatures_c, u) {
            LY_ARRAY_FOR(f->iffeatures_c[u].features, v) {
                /* check for circular dependency - direct reference first,... */
                if (f == f->iffeatures_c[u].features[v]) {
                    LOGVAL(pmod->mod->ctx, LYVE_REFERENCE, "Feature \"%s\" is referenced from itself.", f->name);
                    return LY_EVALID;
                }
                /* ... and indirect circular reference */
                LY_CHECK_RET(lys_compile_feature_circular_check(pmod->mod->ctx, f->iffeatures_c[u].features[v], f->depfeatures));

                /* add itself into the dependants list */
                LY_ARRAY_NEW_RET(pmod->mod->ctx, f->iffeatures_c[u].features[v]->depfeatures, df, LY_EMEM);
                *df = f;
            }
        }
    }

    return LY_SUCCESS;
}